

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

bool_t strStartsWith(char *str,char *prefix)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (prefix[lVar1] == '\0') {
      return 1;
    }
    if (str[lVar1] != prefix[lVar1]) break;
    lVar1 = lVar1 + 1;
  }
  return 0;
}

Assistant:

bool_t strStartsWith(const char* str, const char* prefix)
{
	ASSERT(strIsValid(str));
	ASSERT(strIsValid(prefix));
	for(; *prefix; ++prefix, ++str)
		if (*str != *prefix)
			return FALSE;
	return TRUE;
}